

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_ibuf::xr_ibuf(xr_ibuf *this,xr_ibuf *that)

{
  size_t size;
  unsigned_short *puVar1;
  xr_ibuf *that_local;
  xr_ibuf *this_local;
  
  xr_flexbuf::xr_flexbuf(&this->super_xr_flexbuf,&that->super_xr_flexbuf);
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_ibuf_0038c768;
  xr_flexbuf::set_owner(&this->super_xr_flexbuf,true);
  size = xr_flexbuf::size(&that->super_xr_flexbuf);
  xr_flexbuf::set_size(&this->super_xr_flexbuf,size);
  puVar1 = xr_flexbuf::duplicate<unsigned_short>(&this->super_xr_flexbuf,that->m_indices);
  this->m_indices = puVar1;
  return;
}

Assistant:

xr_ibuf::xr_ibuf(const xr_ibuf& that): xr_flexbuf(that)
{
	set_owner(true);
	set_size(that.size());
	m_indices = duplicate(that.m_indices);
}